

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O3

int mbedtls_pk_parse_key(mbedtls_pk_context *pk,uchar *key,size_t keylen,uchar *pwd,size_t pwdlen)

{
  int iVar1;
  uchar *key_00;
  mbedtls_pk_info_t *pmVar2;
  mbedtls_pem_context pem;
  size_t len;
  mbedtls_pem_context local_50;
  size_t local_38;
  
  if (keylen == 0) {
    return -0x3d00;
  }
  mbedtls_pem_init(&local_50);
  if (key[keylen - 1] != '\0') goto LAB_0010fa11;
  iVar1 = mbedtls_pem_read_buffer
                    (&local_50,"-----BEGIN RSA PRIVATE KEY-----","-----END RSA PRIVATE KEY-----",key
                     ,pwd,pwdlen,&local_38);
  if (iVar1 < -0x1080) {
LAB_0010fb70:
    if (iVar1 == -0x1380) {
      return -0x3b80;
    }
    if (iVar1 != -0x1300) {
      return iVar1;
    }
    return -0x3c00;
  }
  if (iVar1 == -0x1080) {
    if (key[keylen - 1] != '\0') goto LAB_0010fa11;
    iVar1 = mbedtls_pem_read_buffer
                      (&local_50,"-----BEGIN EC PRIVATE KEY-----","-----END EC PRIVATE KEY-----",key
                       ,pwd,pwdlen,&local_38);
    if (iVar1 < -0x1080) goto LAB_0010fb70;
    if (iVar1 == -0x1080) {
      if (key[keylen - 1] != '\0') {
LAB_0010fa11:
        key_00 = (uchar *)calloc(1,keylen);
        if (key_00 == (uchar *)0x0) {
          return -0x3f80;
        }
        memcpy(key_00,key,keylen);
        iVar1 = pk_parse_key_pkcs8_encrypted_der(pk,key_00,keylen,pwd,pwdlen);
        mbedtls_platform_zeroize(key_00,keylen);
        free(key_00);
        if (iVar1 != 0) {
          mbedtls_pk_free(pk);
          mbedtls_pk_init(pk);
          if (iVar1 == -0x3b80) {
            return -0x3b80;
          }
          iVar1 = pk_parse_key_pkcs8_unencrypted_der(pk,key,keylen);
          if (iVar1 != 0) {
            mbedtls_pk_free(pk);
            mbedtls_pk_init(pk);
            pmVar2 = mbedtls_pk_info_from_type(MBEDTLS_PK_RSA);
            iVar1 = mbedtls_pk_setup(pk,pmVar2);
            if ((iVar1 != 0) ||
               (iVar1 = pk_parse_key_pkcs1_der((mbedtls_rsa_context *)pk->pk_ctx,key,keylen),
               iVar1 != 0)) {
              mbedtls_pk_free(pk);
              mbedtls_pk_init(pk);
              pmVar2 = mbedtls_pk_info_from_type(MBEDTLS_PK_ECKEY);
              iVar1 = mbedtls_pk_setup(pk,pmVar2);
              if ((iVar1 == 0) &&
                 (iVar1 = pk_parse_key_sec1_der((mbedtls_ecp_keypair *)pk->pk_ctx,key,keylen),
                 iVar1 == 0)) {
                return 0;
              }
              mbedtls_pk_free(pk);
              return -0x3d00;
            }
          }
        }
        return 0;
      }
      iVar1 = mbedtls_pem_read_buffer
                        (&local_50,"-----BEGIN PRIVATE KEY-----","-----END PRIVATE KEY-----",key,
                         (uchar *)0x0,0,&local_38);
      if (iVar1 == -0x1080) {
        if ((key[keylen - 1] != '\0') ||
           (iVar1 = mbedtls_pem_read_buffer
                              (&local_50,"-----BEGIN ENCRYPTED PRIVATE KEY-----",
                               "-----END ENCRYPTED PRIVATE KEY-----",key,(uchar *)0x0,0,&local_38),
           iVar1 == -0x1080)) goto LAB_0010fa11;
        if (iVar1 != 0) {
          return iVar1;
        }
        iVar1 = pk_parse_key_pkcs8_encrypted_der(pk,local_50.buf,local_50.buflen,pwd,pwdlen);
      }
      else {
        if (iVar1 != 0) {
          return iVar1;
        }
        iVar1 = pk_parse_key_pkcs8_unencrypted_der(pk,local_50.buf,local_50.buflen);
      }
      if (iVar1 == 0) goto LAB_0010fbdd;
    }
    else {
      if (iVar1 != 0) {
        return iVar1;
      }
      pmVar2 = mbedtls_pk_info_from_type(MBEDTLS_PK_ECKEY);
      iVar1 = mbedtls_pk_setup(pk,pmVar2);
      if (iVar1 == 0) {
        iVar1 = pk_parse_key_sec1_der
                          ((mbedtls_ecp_keypair *)pk->pk_ctx,local_50.buf,local_50.buflen);
        goto LAB_0010fbcb;
      }
    }
  }
  else {
    if (iVar1 != 0) {
      return iVar1;
    }
    pmVar2 = mbedtls_pk_info_from_type(MBEDTLS_PK_RSA);
    iVar1 = mbedtls_pk_setup(pk,pmVar2);
    if (iVar1 == 0) {
      iVar1 = pk_parse_key_pkcs1_der((mbedtls_rsa_context *)pk->pk_ctx,local_50.buf,local_50.buflen)
      ;
LAB_0010fbcb:
      if (iVar1 == 0) {
        iVar1 = 0;
        goto LAB_0010fbdd;
      }
    }
  }
  mbedtls_pk_free(pk);
LAB_0010fbdd:
  mbedtls_pem_free(&local_50);
  return iVar1;
}

Assistant:

int mbedtls_pk_parse_key( mbedtls_pk_context *pk,
                  const unsigned char *key, size_t keylen,
                  const unsigned char *pwd, size_t pwdlen )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    const mbedtls_pk_info_t *pk_info;
#if defined(MBEDTLS_PEM_PARSE_C)
    size_t len;
    mbedtls_pem_context pem;
#endif

    PK_VALIDATE_RET( pk != NULL );
    if( keylen == 0 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT );
    PK_VALIDATE_RET( key != NULL );

#if defined(MBEDTLS_PEM_PARSE_C)
   mbedtls_pem_init( &pem );

#if defined(MBEDTLS_RSA_C)
    /* Avoid calling mbedtls_pem_read_buffer() on non-null-terminated string */
    if( key[keylen - 1] != '\0' )
        ret = MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    else
        ret = mbedtls_pem_read_buffer( &pem,
                               "-----BEGIN RSA PRIVATE KEY-----",
                               "-----END RSA PRIVATE KEY-----",
                               key, pwd, pwdlen, &len );

    if( ret == 0 )
    {
        pk_info = mbedtls_pk_info_from_type( MBEDTLS_PK_RSA );
        if( ( ret = mbedtls_pk_setup( pk, pk_info ) ) != 0 ||
            ( ret = pk_parse_key_pkcs1_der( mbedtls_pk_rsa( *pk ),
                                            pem.buf, pem.buflen ) ) != 0 )
        {
            mbedtls_pk_free( pk );
        }

        mbedtls_pem_free( &pem );
        return( ret );
    }
    else if( ret == MBEDTLS_ERR_PEM_PASSWORD_MISMATCH )
        return( MBEDTLS_ERR_PK_PASSWORD_MISMATCH );
    else if( ret == MBEDTLS_ERR_PEM_PASSWORD_REQUIRED )
        return( MBEDTLS_ERR_PK_PASSWORD_REQUIRED );
    else if( ret != MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT )
        return( ret );
#endif /* MBEDTLS_RSA_C */

#if defined(MBEDTLS_ECP_C)
    /* Avoid calling mbedtls_pem_read_buffer() on non-null-terminated string */
    if( key[keylen - 1] != '\0' )
        ret = MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    else
        ret = mbedtls_pem_read_buffer( &pem,
                               "-----BEGIN EC PRIVATE KEY-----",
                               "-----END EC PRIVATE KEY-----",
                               key, pwd, pwdlen, &len );
    if( ret == 0 )
    {
        pk_info = mbedtls_pk_info_from_type( MBEDTLS_PK_ECKEY );

        if( ( ret = mbedtls_pk_setup( pk, pk_info ) ) != 0 ||
            ( ret = pk_parse_key_sec1_der( mbedtls_pk_ec( *pk ),
                                           pem.buf, pem.buflen ) ) != 0 )
        {
            mbedtls_pk_free( pk );
        }

        mbedtls_pem_free( &pem );
        return( ret );
    }
    else if( ret == MBEDTLS_ERR_PEM_PASSWORD_MISMATCH )
        return( MBEDTLS_ERR_PK_PASSWORD_MISMATCH );
    else if( ret == MBEDTLS_ERR_PEM_PASSWORD_REQUIRED )
        return( MBEDTLS_ERR_PK_PASSWORD_REQUIRED );
    else if( ret != MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT )
        return( ret );
#endif /* MBEDTLS_ECP_C */

    /* Avoid calling mbedtls_pem_read_buffer() on non-null-terminated string */
    if( key[keylen - 1] != '\0' )
        ret = MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    else
        ret = mbedtls_pem_read_buffer( &pem,
                               "-----BEGIN PRIVATE KEY-----",
                               "-----END PRIVATE KEY-----",
                               key, NULL, 0, &len );
    if( ret == 0 )
    {
        if( ( ret = pk_parse_key_pkcs8_unencrypted_der( pk,
                                                pem.buf, pem.buflen ) ) != 0 )
        {
            mbedtls_pk_free( pk );
        }

        mbedtls_pem_free( &pem );
        return( ret );
    }
    else if( ret != MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT )
        return( ret );

#if defined(MBEDTLS_PKCS12_C) || defined(MBEDTLS_PKCS5_C)
    /* Avoid calling mbedtls_pem_read_buffer() on non-null-terminated string */
    if( key[keylen - 1] != '\0' )
        ret = MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    else
        ret = mbedtls_pem_read_buffer( &pem,
                               "-----BEGIN ENCRYPTED PRIVATE KEY-----",
                               "-----END ENCRYPTED PRIVATE KEY-----",
                               key, NULL, 0, &len );
    if( ret == 0 )
    {
        if( ( ret = pk_parse_key_pkcs8_encrypted_der( pk,
                                                      pem.buf, pem.buflen,
                                                      pwd, pwdlen ) ) != 0 )
        {
            mbedtls_pk_free( pk );
        }

        mbedtls_pem_free( &pem );
        return( ret );
    }
    else if( ret != MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT )
        return( ret );
#endif /* MBEDTLS_PKCS12_C || MBEDTLS_PKCS5_C */
#else
    ((void) pwd);
    ((void) pwdlen);
#endif /* MBEDTLS_PEM_PARSE_C */

    /*
     * At this point we only know it's not a PEM formatted key. Could be any
     * of the known DER encoded private key formats
     *
     * We try the different DER format parsers to see if one passes without
     * error
     */
#if defined(MBEDTLS_PKCS12_C) || defined(MBEDTLS_PKCS5_C)
    {
        unsigned char *key_copy;

        if( ( key_copy = mbedtls_calloc( 1, keylen ) ) == NULL )
            return( MBEDTLS_ERR_PK_ALLOC_FAILED );

        memcpy( key_copy, key, keylen );

        ret = pk_parse_key_pkcs8_encrypted_der( pk, key_copy, keylen,
                                                pwd, pwdlen );

        mbedtls_platform_zeroize( key_copy, keylen );
        mbedtls_free( key_copy );
    }

    if( ret == 0 )
        return( 0 );

    mbedtls_pk_free( pk );
    mbedtls_pk_init( pk );

    if( ret == MBEDTLS_ERR_PK_PASSWORD_MISMATCH )
    {
        return( ret );
    }
#endif /* MBEDTLS_PKCS12_C || MBEDTLS_PKCS5_C */

    if( ( ret = pk_parse_key_pkcs8_unencrypted_der( pk, key, keylen ) ) == 0 )
        return( 0 );

    mbedtls_pk_free( pk );
    mbedtls_pk_init( pk );

#if defined(MBEDTLS_RSA_C)

    pk_info = mbedtls_pk_info_from_type( MBEDTLS_PK_RSA );
    if( mbedtls_pk_setup( pk, pk_info ) == 0 &&
        pk_parse_key_pkcs1_der( mbedtls_pk_rsa( *pk ), key, keylen ) == 0 )
    {
        return( 0 );
    }

    mbedtls_pk_free( pk );
    mbedtls_pk_init( pk );
#endif /* MBEDTLS_RSA_C */

#if defined(MBEDTLS_ECP_C)
    pk_info = mbedtls_pk_info_from_type( MBEDTLS_PK_ECKEY );
    if( mbedtls_pk_setup( pk, pk_info ) == 0 &&
        pk_parse_key_sec1_der( mbedtls_pk_ec( *pk ),
                               key, keylen ) == 0 )
    {
        return( 0 );
    }
    mbedtls_pk_free( pk );
#endif /* MBEDTLS_ECP_C */

    /* If MBEDTLS_RSA_C is defined but MBEDTLS_ECP_C isn't,
     * it is ok to leave the PK context initialized but not
     * freed: It is the caller's responsibility to call pk_init()
     * before calling this function, and to call pk_free()
     * when it fails. If MBEDTLS_ECP_C is defined but MBEDTLS_RSA_C
     * isn't, this leads to mbedtls_pk_free() being called
     * twice, once here and once by the caller, but this is
     * also ok and in line with the mbedtls_pk_free() calls
     * on failed PEM parsing attempts. */

    return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT );
}